

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.c
# Opt level: O0

void glfwSetCursor(GLFWwindow *windowHandle,GLFWcursor *cursorHandle)

{
  _GLFWwindow *in_RSI;
  long in_RDI;
  _GLFWcursor *cursor;
  _GLFWwindow *window;
  _GLFWcursor *in_stack_ffffffffffffffd8;
  
  if (_glfw.initialized == 0) {
    _glfwInputError(0x10001,(char *)0x0);
  }
  else {
    *(_GLFWwindow **)(in_RDI + 0x48) = in_RSI;
    _glfwPlatformSetCursor(in_RSI,in_stack_ffffffffffffffd8);
  }
  return;
}

Assistant:

GLFWAPI void glfwSetCursor(GLFWwindow* windowHandle, GLFWcursor* cursorHandle)
{
    _GLFWwindow* window = (_GLFWwindow*) windowHandle;
    _GLFWcursor* cursor = (_GLFWcursor*) cursorHandle;
    assert(window != NULL);

    _GLFW_REQUIRE_INIT();

    window->cursor = cursor;

    _glfwPlatformSetCursor(window, cursor);
}